

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int CVodeSetJacFn(void *cvode_mem,CVLsJacFn jac)

{
  int iVar1;
  void **ppvVar2;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeMem local_28;
  CVLsMem local_20;
  
  ppvVar2 = &local_28;
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetJacFn",&local_28,&local_20);
  if (iVar1 == 0) {
    if (jac == (CVLsJacFn)0x0) {
      local_20->jacDQ = 1;
      local_20->jac = cvLsDQJac;
    }
    else {
      if (local_20->A == (SUNMatrix)0x0) {
        cvProcessError(local_28,-3,0x128,"CVodeSetJacFn",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                       ,"Jacobian routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      local_20->jacDQ = 0;
      local_20->jac = jac;
      ppvVar2 = &local_28->cv_user_data;
    }
    local_20->J_data = *ppvVar2;
    local_20->user_linsys = 0;
    local_20->linsys = cvLsLinSys;
    local_20->A_data = local_28;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetJacFn(void* cvode_mem, CVLsJacFn jac)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (cvls_mem->A == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return (CVLS_ILL_INPUT);
  }

  /* set the Jacobian routine pointer, and update relevant flags */
  if (jac != NULL)
  {
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = jac;
    cvls_mem->J_data = cv_mem->cv_user_data;
  }
  else
  {
    cvls_mem->jacDQ  = SUNTRUE;
    cvls_mem->jac    = cvLsDQJac;
    cvls_mem->J_data = cv_mem;
  }

  /* ensure the internal linear system function is used */
  cvls_mem->user_linsys = SUNFALSE;
  cvls_mem->linsys      = cvLsLinSys;
  cvls_mem->A_data      = cv_mem;

  return (CVLS_SUCCESS);
}